

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall c4::yml::Tree::root_id(Tree *this)

{
  bool bVar1;
  error_flags eVar2;
  long in_RDI;
  Location in_stack_00000000;
  size_t in_stack_00000228;
  Tree *in_stack_00000230;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  Location *in_stack_ffffffffffffffb0;
  char (*in_stack_fffffffffffffff0) [38];
  
  if (*(long *)(in_RDI + 8) == 0) {
    reserve(in_stack_00000230,in_stack_00000228);
  }
  if ((*(long *)(in_RDI + 8) == 0) || (*(long *)(in_RDI + 0x10) == 0)) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
                       ,in_stack_ffffffffffffff98);
    error<38ul>(in_stack_fffffffffffffff0,in_stack_00000000);
  }
  return 0;
}

Assistant:

size_t root_id()       { if(m_cap == 0) { reserve(16); } RYML_ASSERT(m_cap > 0 && m_size > 0); return 0; }